

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int little2_scanRef(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  undefined1 uVar2;
  char cVar3;
  byte *pbVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  long lVar8;
  byte *pbVar9;
  
  if (ptr == end) {
    return -1;
  }
  bVar1 = ptr[1];
  if (bVar1 < 0xdc) {
    bVar7 = 7;
    if (3 < bVar1 - 0xd8) {
      if (bVar1 == 0) {
        bVar7 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      }
      else {
LAB_004e4033:
        bVar7 = 0x1d;
      }
    }
  }
  else if (bVar1 - 0xdc < 4) {
    bVar7 = 8;
  }
  else {
    if ((bVar1 != 0xff) || ((byte)*ptr < 0xfe)) goto LAB_004e4033;
    bVar7 = 0;
  }
  iVar6 = 0;
  iVar5 = 0;
  pbVar4 = (byte *)ptr;
  if (bVar7 < 0x13) {
    if (bVar7 == 5) {
      iVar6 = iVar5;
      if ((long)end - (long)ptr < 2) {
        return -2;
      }
    }
    else if (bVar7 == 6) {
      iVar6 = iVar5;
      if ((long)end - (long)ptr < 3) {
        return -2;
      }
    }
    else {
      iVar6 = iVar5;
      if ((bVar7 == 7) && ((long)end - (long)ptr < 4)) {
        return -2;
      }
    }
  }
  else if (bVar7 < 0x18) {
    if (bVar7 == 0x13) {
      pbVar4 = (byte *)(ptr + 2);
      if (pbVar4 == (byte *)end) {
        return -1;
      }
      if (ptr[3] == '\0') {
        if ((ulong)*pbVar4 == 0x78) {
          pbVar4 = (byte *)(ptr + 4);
          if (pbVar4 == (byte *)end) {
            return -1;
          }
          iVar6 = iVar5;
          if ((ptr[5] == '\0') &&
             ((*(byte *)((long)enc[1].scanners + (ulong)*pbVar4) & 0xfe) == 0x18)) {
            pbVar4 = (byte *)(ptr + 6);
            do {
              if (pbVar4 == (byte *)end) {
                return -1;
              }
              bVar1 = pbVar4[1];
              if (bVar1 < 0xdc) {
                bVar7 = 7;
                if (3 < bVar1 - 0xd8) {
                  if (bVar1 == 0) {
                    bVar7 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar4);
                  }
                  else {
LAB_004e429e:
                    bVar7 = 0x1d;
                  }
                }
              }
              else if (bVar1 - 0xdc < 4) {
                bVar7 = 8;
              }
              else {
                if ((bVar1 != 0xff) || (*pbVar4 < 0xfe)) goto LAB_004e429e;
                bVar7 = 0;
              }
              if (1 < bVar7 - 0x18) {
                if (bVar7 == 0x12) {
                  pbVar4 = pbVar4 + 2;
                  iVar6 = 10;
                }
                break;
              }
              pbVar4 = pbVar4 + 2;
            } while( true );
          }
        }
        else {
          iVar6 = iVar5;
          if (*(char *)((long)enc[1].scanners + (ulong)*pbVar4) == '\x19') {
            do {
              pbVar9 = pbVar4;
              pbVar4 = pbVar9 + 2;
              if (pbVar4 == (byte *)end) {
                return -1;
              }
              bVar1 = pbVar9[3];
              if (bVar1 < 0xdc) {
                cVar3 = '\a';
                if (3 < bVar1 - 0xd8) {
                  if (bVar1 == 0) {
                    cVar3 = *(char *)((long)enc[1].scanners + (ulong)*pbVar4);
                  }
                  else {
LAB_004e4367:
                    cVar3 = '\x1d';
                  }
                }
              }
              else if (bVar1 - 0xdc < 4) {
                cVar3 = '\b';
              }
              else {
                if ((bVar1 != 0xff) || (*pbVar4 < 0xfe)) goto LAB_004e4367;
                cVar3 = '\0';
              }
            } while (cVar3 == '\x19');
            if (cVar3 == '\x12') {
              pbVar4 = pbVar9 + 4;
              iVar6 = 10;
            }
          }
        }
      }
    }
    else if (bVar7 == 0x16) goto LAB_004e40de;
  }
  else if ((bVar7 == 0x18) ||
          ((iVar6 = iVar5, bVar7 == 0x1d &&
           ((*(uint *)((long)namingBitmap +
                      (ulong)((byte)*ptr >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)
                      ) >> ((byte)*ptr & 0x1f) & 1) != 0)))) {
LAB_004e40de:
    pbVar4 = (byte *)(ptr + 2);
    if (pbVar4 == (byte *)end) {
      return -1;
    }
    lVar8 = (long)end - (long)ptr;
    do {
      lVar8 = lVar8 + -2;
      bVar1 = pbVar4[1];
      if (bVar1 < 0xdc) {
        uVar2 = 7;
        if (3 < bVar1 - 0xd8) {
          if (bVar1 == 0) {
            uVar2 = *(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar4);
          }
          else {
LAB_004e4161:
            uVar2 = 0x1d;
          }
        }
      }
      else if (bVar1 - 0xdc < 4) {
        uVar2 = 8;
      }
      else {
        if ((bVar1 != 0xff) || (*pbVar4 < 0xfe)) goto LAB_004e4161;
        uVar2 = 0;
      }
      iVar6 = iVar5;
      switch(uVar2) {
      case 5:
        if (lVar8 < 2) {
          return -2;
        }
        goto switchD_004e417d_caseD_8;
      case 6:
        if (lVar8 < 3) {
          return -2;
        }
        goto switchD_004e417d_caseD_8;
      case 7:
        if (lVar8 < 4) {
          return -2;
        }
      default:
        goto switchD_004e417d_caseD_8;
      case 0x12:
        pbVar4 = pbVar4 + 2;
        iVar6 = 9;
        goto switchD_004e417d_caseD_8;
      case 0x1d:
        if ((*(uint *)((long)namingBitmap +
                      (ulong)(*pbVar4 >> 3 & 0x1c | (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5
                             )) >> (*pbVar4 & 0x1f) & 1) == 0) goto switchD_004e417d_caseD_8;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        pbVar4 = pbVar4 + 2;
        if (pbVar4 == (byte *)end) {
          return -1;
        }
      }
    } while( true );
  }
switchD_004e417d_caseD_8:
  *nextTokPtr = (char *)pbVar4;
  return iVar6;
}

Assistant:

static
int PREFIX(scanRef)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_PARTIAL;
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_NUM:
    return PREFIX(scanCharRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}